

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

AtomicRMW * __thiscall
wasm::Builder::makeAtomicRMW
          (Builder *this,AtomicRMWOp op,uint bytes,Address offset,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  AtomicRMW *this_00;
  AtomicRMW *ret;
  Expression *value_local;
  Expression *ptr_local;
  uint bytes_local;
  AtomicRMWOp op_local;
  Builder *this_local;
  Type type_local;
  Address offset_local;
  
  this_00 = MixedArena::alloc<wasm::AtomicRMW>(&this->wasm->allocator);
  this_00->op = op;
  this_00->bytes = (uint8_t)bytes;
  (this_00->offset).addr = offset.addr;
  this_00->ptr = ptr;
  this_00->value = value;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = type.id;
  AtomicRMW::finalize(this_00);
  wasm::Name::operator=(&this_00->memory,&memory);
  return this_00;
}

Assistant:

AtomicRMW* makeAtomicRMW(AtomicRMWOp op,
                           unsigned bytes,
                           Address offset,
                           Expression* ptr,
                           Expression* value,
                           Type type,
                           Name memory) {
    auto* ret = wasm.allocator.alloc<AtomicRMW>();
    ret->op = op;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->ptr = ptr;
    ret->value = value;
    ret->type = type;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }